

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O0

void __thiscall TRM::BitmapDevice::BitmapDevice(BitmapDevice *this,shared_ptr<TRM::Bitmap> *bitmap)

{
  uint32_t uVar1;
  uint32_t uVar2;
  element_type *peVar3;
  size_type __n;
  float local_68 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  shared_ptr<TRM::Bitmap> *local_18;
  shared_ptr<TRM::Bitmap> *bitmap_local;
  BitmapDevice *this_local;
  
  (this->super_Device)._vptr_Device = (_func_int **)0x0;
  local_18 = bitmap;
  bitmap_local = (shared_ptr<TRM::Bitmap> *)this;
  Device::Device(&this->super_Device);
  (this->super_Device)._vptr_Device = (_func_int **)&PTR__BitmapDevice_00149ce8;
  std::shared_ptr<TRM::Bitmap>::shared_ptr(&this->mBitmap,bitmap);
  std::vector<float,_std::allocator<float>_>::vector(&this->mZBuffer);
  IdentityMatrix();
  (this->mMatrix).value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_28;
  (this->mMatrix).value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_28._4_4_;
  (this->mMatrix).value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_20;
  (this->mMatrix).value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_20._4_4_;
  (this->mMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_38;
  (this->mMatrix).value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_38._4_4_;
  (this->mMatrix).value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_30;
  (this->mMatrix).value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_30._4_4_;
  (this->mMatrix).value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_48;
  (this->mMatrix).value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_48._4_4_;
  (this->mMatrix).value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_40;
  (this->mMatrix).value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_40._4_4_;
  (this->mMatrix).value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_58;
  (this->mMatrix).value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_58._4_4_;
  (this->mMatrix).value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_50;
  (this->mMatrix).value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_50._4_4_;
  peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mBitmap);
  uVar1 = Bitmap::width(peVar3);
  peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mBitmap);
  uVar2 = Bitmap::height(peVar3);
  std::vector<float,_std::allocator<float>_>::resize(&this->mZBuffer,(ulong)(uVar1 * uVar2));
  __n = std::vector<float,_std::allocator<float>_>::size(&this->mZBuffer);
  local_68[0] = std::numeric_limits<float>::max();
  std::vector<float,_std::allocator<float>_>::assign(&this->mZBuffer,__n,local_68);
  return;
}

Assistant:

BitmapDevice::BitmapDevice(std::shared_ptr<Bitmap> bitmap)
    : Device(), mBitmap(std::move(bitmap)) {
  mMatrix = IdentityMatrix();
  mZBuffer.resize(mBitmap->width() * mBitmap->height());
  mZBuffer.assign(mZBuffer.size(), std::numeric_limits<float>::max());
}